

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O3

int __thiscall
QMakeProperty::queryProperty
          (QMakeProperty *this,QStringList *optionProperties,PropertyPrinter *printer)

{
  char *pcVar1;
  char16_t *pcVar2;
  size_t sVar3;
  bool bVar4;
  storage_type *psVar5;
  QString *prop;
  QString *pQVar6;
  storage_type *psVar7;
  ProString *other;
  uint i;
  long lVar8;
  QString *prop_1;
  QArrayData *pQVar9;
  long lVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QAnyStringView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  ProString dval;
  ProString sval;
  ProString gval;
  ProString pval;
  ProKey pkey;
  int local_1f8;
  QStringBuilder<const_QString_&,_const_char_(&)[5]> local_1e8;
  QStringBuilder<const_QString_&,_const_char_(&)[5]> local_1d8;
  size_t local_1c8;
  undefined1 local_1b8 [32];
  char (*pacStack_198) [5];
  size_t local_190;
  ProString local_188;
  ProString local_158;
  ProString local_128;
  undefined1 local_f8 [24];
  undefined8 uStack_e0;
  char16_t *pcStack_d8;
  size_t sStack_d0;
  QArrayDataPointer<QString> local_c8;
  QArrayDataPointer<QString> local_a8;
  QArrayDataPointer<std::pair<QString,_QString>_> local_88;
  undefined1 local_68 [24];
  QArrayData *pQStack_50;
  char16_t *local_48;
  size_t sStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.d = (Data *)0x0;
  local_88.ptr = (pair<QString,_QString> *)0x0;
  local_88.size = 0;
  lVar8 = (optionProperties->d).size;
  if (lVar8 == 0) {
    initSettings(this);
    local_a8.size = -0x5555555555555556;
    local_a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_a8.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    QSettings::childKeys();
    pQVar6 = local_a8.ptr;
    if (local_a8.size != 0) {
      lVar8 = local_a8.size * 0x18;
      lVar10 = 0;
      do {
        local_f8._16_8_ = 0xaaaaaaaaaaaaaaaa;
        local_f8._0_8_ = (QArrayData *)0xaaaaaaaaaaaaaaaa;
        local_f8._8_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
        QVar12.m_size = (size_t)this->settings;
        QVar12.field_0.m_data = local_68;
        QSettings::value(QVar12);
        QVariant::toString();
        QVariant::~QVariant((QVariant *)local_68);
        local_68._0_8_ = *(long *)((long)&(pQVar6->d).d + lVar10);
        local_68._8_8_ = *(undefined8 *)((long)&(pQVar6->d).ptr + lVar10);
        local_68._16_8_ = *(size_t *)((long)&(pQVar6->d).size + lVar10);
        if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_68._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_68._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        pQStack_50 = (QArrayData *)local_f8._0_8_;
        local_48 = (char16_t *)local_f8._8_8_;
        sStack_40 = local_f8._16_8_;
        if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QtPrivate::QMovableArrayOps<std::pair<QString,QString>>::emplace<std::pair<QString,QString>>
                  ((QMovableArrayOps<std::pair<QString,QString>> *)&local_88,local_88.size,
                   (pair<QString,_QString> *)local_68);
        QList<std::pair<QString,_QString>_>::end((QList<std::pair<QString,_QString>_> *)&local_88);
        if (pQStack_50 != (QArrayData *)0x0) {
          LOCK();
          (pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQStack_50,2,0x10);
          }
        }
        if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
          }
        }
        lVar10 = lVar10 + 0x18;
      } while (lVar8 != lVar10);
    }
    local_c8.d = (Data *)0x0;
    local_c8.ptr = (QString *)0x0;
    local_c8.size = 0;
    lVar8 = 0;
    do {
      if (propList[lVar8].name == (char *)0x0) {
        psVar7 = (storage_type *)0x0;
      }
      else {
        psVar5 = (storage_type *)0xffffffffffffffff;
        do {
          psVar7 = psVar5 + 1;
          pcVar1 = psVar5 + (long)(propList[lVar8].name + 1);
          psVar5 = psVar7;
        } while (*pcVar1 != '\0');
      }
      QVar13.m_data = psVar7;
      QVar13.m_size = (qsizetype)local_68;
      QString::fromLatin1(QVar13);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_c8,local_c8.size,(QString *)local_68);
      QList<QString>::end((QList<QString> *)&local_c8);
      if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x17);
    QVar14.m_data = (storage_type *)0xd;
    QVar14.m_size = (qsizetype)local_68;
    QString::fromUtf8(QVar14);
    local_f8._0_8_ = local_68._0_8_;
    local_f8._8_8_ = local_68._8_8_;
    local_f8._16_8_ = local_68._16_8_;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_c8,local_c8.size,(QString *)local_f8);
    QList<QString>::end((QList<QString> *)&local_c8);
    if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
      }
    }
    QVar15.m_data = (storage_type *)0xa;
    QVar15.m_size = (qsizetype)local_68;
    QString::fromUtf8(QVar15);
    local_f8._0_8_ = local_68._0_8_;
    local_f8._8_8_ = local_68._8_8_;
    local_f8._16_8_ = local_68._16_8_;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_c8,local_c8.size,(QString *)local_f8);
    QList<QString>::end((QList<QString> *)&local_c8);
    if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
      }
    }
    if (local_c8.size != 0) {
      lVar8 = local_c8.size * 0x18;
      pQVar9 = (QArrayData *)local_c8.ptr;
      do {
        local_48 = (char16_t *)0xaaaaaaaaaaaaaaaa;
        sStack_40 = 0xaaaaaaaaaaaaaaaa;
        local_68._16_8_ = 0xaaaaaaaaaaaaaaaa;
        pQStack_50 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
        local_68._0_8_ = (QArrayData *)0xaaaaaaaaaaaaaaaa;
        local_68._8_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
        ProKey::ProKey((ProKey *)local_f8,(QString *)pQVar9);
        value((ProString *)local_68,this,(ProKey *)local_f8);
        if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
          }
        }
        pcStack_d8 = (char16_t *)0xaaaaaaaaaaaaaaaa;
        sStack_d0 = 0xaaaaaaaaaaaaaaaa;
        local_f8._16_8_ = 0xaaaaaaaaaaaaaaaa;
        uStack_e0 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
        local_f8._0_8_ = (QArrayData *)0xaaaaaaaaaaaaaaaa;
        local_f8._8_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_158.m_string.d.ptr = L"/raw";
        local_158.m_string.d.d = (Data *)pQVar9;
        ProString::ProString<QString_const&,char_const(&)[5]>
                  (&local_128,(QStringBuilder<const_QString_&,_const_char_(&)[5]> *)&local_158);
        value((ProString *)local_f8,this,(ProKey *)&local_128);
        if (&(local_128.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_128.m_file = -0x55555556;
        local_128._36_4_ = 0xaaaaaaaa;
        local_128.m_hash = 0xaaaaaaaaaaaaaaaa;
        local_128.m_string.d.size = -0x5555555555555556;
        local_128.m_offset = -0x55555556;
        local_128.m_length = -0x55555556;
        local_128.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_128.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_188.m_string.d.ptr = L"/get";
        local_188.m_string.d.d = (Data *)pQVar9;
        ProString::ProString<QString_const&,char_const(&)[5]>
                  (&local_158,(QStringBuilder<const_QString_&,_const_char_(&)[5]> *)&local_188);
        value(&local_128,this,(ProKey *)&local_158);
        if (&(local_158.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_158.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_158.m_file = -0x55555556;
        local_158._36_4_ = 0xaaaaaaaa;
        local_158.m_hash = 0xaaaaaaaaaaaaaaaa;
        local_158.m_string.d.size = 0xaaaaaaaaaaaaaaaa;
        local_158.m_offset = -0x55555556;
        local_158.m_length = -0x55555556;
        local_158.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_158.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_1b8._8_8_ = "/src";
        local_1b8._0_8_ = pQVar9;
        ProString::ProString<QString_const&,char_const(&)[5]>
                  (&local_188,(QStringBuilder<const_QString_&,_const_char_(&)[5]> *)local_1b8);
        value(&local_158,this,(ProKey *)&local_188);
        if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_188.m_file = -0x55555556;
        local_188._36_4_ = 0xaaaaaaaa;
        local_188.m_hash = 0xaaaaaaaaaaaaaaaa;
        local_188.m_string.d.size = -0x5555555555555556;
        local_188.m_offset = -0x55555556;
        local_188.m_length = -0x55555556;
        local_188.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_188.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_1d8.b = (char (*) [5])0x1136da;
        local_1d8.a = (QString *)pQVar9;
        ProString::ProString<QString_const&,char_const(&)[5]>((ProString *)local_1b8,&local_1d8);
        value(&local_188,this,(ProKey *)local_1b8);
        if ((QArrayData *)local_1b8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
          }
        }
        ProString::toQString((QString *)&local_1d8,(ProString *)local_68);
        local_190 = local_1c8;
        pacStack_198 = local_1d8.b;
        local_1b8._24_8_ = local_1d8.a;
        local_1b8._0_8_ = *(undefined8 *)pQVar9;
        local_1b8._8_8_ = pQVar9->alloc;
        local_1b8._16_4_ = pQVar9[1].ref_;
        local_1b8._20_4_ = pQVar9[1].flags;
        if ((QArrayData *)local_1b8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_1b8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_1b8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_1d8.a = (QString *)0x0;
        local_1d8.b = (char (*) [5])0x0;
        local_1c8 = 0;
        QtPrivate::QMovableArrayOps<std::pair<QString,QString>>::emplace<std::pair<QString,QString>>
                  ((QMovableArrayOps<std::pair<QString,QString>> *)&local_88,local_88.size,
                   (pair<QString,_QString> *)local_1b8);
        QList<std::pair<QString,_QString>_>::end((QList<std::pair<QString,_QString>_> *)&local_88);
        if ((QArrayData *)local_1b8._24_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_1b8._24_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_1b8._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_1b8._24_8_)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_1b8._24_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_1b8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_1d8.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_1d8.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_1d8.a)->d)->_q_value).super___atomic_base<int>._M_i + -1
          ;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_1d8.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_1d8.a,2,0x10);
          }
        }
        if ((uStack_e0._4_4_ != 0) &&
           (bVar4 = ProString::operator==((ProString *)local_f8,(ProString *)local_68), !bVar4)) {
          local_1e8.b = (char (*) [5])0x1136df;
          local_1e8.a = (QString *)pQVar9;
          ProString::toQString((QString *)&local_1d8,(ProString *)local_f8);
          QStringBuilder<const_QString_&,_const_char_(&)[5]>::convertTo<QString>
                    ((QString *)local_1b8,&local_1e8);
          local_190 = local_1c8;
          pacStack_198 = local_1d8.b;
          local_1b8._24_8_ = local_1d8.a;
          local_1d8.a = (QString *)0x0;
          local_1d8.b = (char (*) [5])0x0;
          local_1c8 = 0;
          QtPrivate::QMovableArrayOps<std::pair<QString,QString>>::
          emplace<std::pair<QString,QString>>
                    ((QMovableArrayOps<std::pair<QString,QString>> *)&local_88,local_88.size,
                     (pair<QString,_QString> *)local_1b8);
          QList<std::pair<QString,_QString>_>::end((QList<std::pair<QString,_QString>_> *)&local_88)
          ;
          if ((QArrayData *)local_1b8._24_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_1b8._24_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_1b8._24_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_1b8._24_8_)->_q_value).super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate((QArrayData *)local_1b8._24_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_1b8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_1d8.a != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(local_1d8.a)->d)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&(local_1d8.a)->d)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&(local_1d8.a)->d)->_q_value).super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate((QArrayData *)local_1d8.a,2,0x10);
            }
          }
        }
        if (local_128.m_length != 0) {
          other = (ProString *)local_f8;
          if (uStack_e0._4_4_ == 0) {
            other = (ProString *)local_68;
          }
          bVar4 = ProString::operator==(&local_128,other);
          if (!bVar4) {
            local_1e8.b = (char (*) [5])0x1136d5;
            local_1e8.a = (QString *)pQVar9;
            ProString::toQString((QString *)&local_1d8,&local_128);
            QStringBuilder<const_QString_&,_const_char_(&)[5]>::convertTo<QString>
                      ((QString *)local_1b8,&local_1e8);
            local_190 = local_1c8;
            pacStack_198 = local_1d8.b;
            local_1b8._24_8_ = local_1d8.a;
            local_1d8.a = (QString *)0x0;
            local_1d8.b = (char (*) [5])0x0;
            local_1c8 = 0;
            QtPrivate::QMovableArrayOps<std::pair<QString,QString>>::
            emplace<std::pair<QString,QString>>
                      ((QMovableArrayOps<std::pair<QString,QString>> *)&local_88,local_88.size,
                       (pair<QString,_QString> *)local_1b8);
            QList<std::pair<QString,_QString>_>::end
                      ((QList<std::pair<QString,_QString>_> *)&local_88);
            if ((QArrayData *)local_1b8._24_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_1b8._24_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_1b8._24_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_1b8._24_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_1b8._24_8_,2,0x10);
              }
            }
            if ((QArrayData *)local_1b8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
              }
            }
            if ((QArrayData *)local_1d8.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&(local_1d8.a)->d)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&(local_1d8.a)->d)->_q_value).super___atomic_base<int>._M_i
                   + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&(local_1d8.a)->d)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)local_1d8.a,2,0x10);
              }
            }
          }
        }
        if ((local_158.m_length != 0) &&
           (bVar4 = ProString::operator==(&local_158,&local_128), !bVar4)) {
          local_1e8.b = (char (*) [5])0x1136d0;
          local_1e8.a = (QString *)pQVar9;
          ProString::toQString((QString *)&local_1d8,&local_158);
          QStringBuilder<const_QString_&,_const_char_(&)[5]>::convertTo<QString>
                    ((QString *)local_1b8,&local_1e8);
          local_190 = local_1c8;
          pacStack_198 = local_1d8.b;
          local_1b8._24_8_ = local_1d8.a;
          local_1d8.a = (QString *)0x0;
          local_1d8.b = (char (*) [5])0x0;
          local_1c8 = 0;
          QtPrivate::QMovableArrayOps<std::pair<QString,QString>>::
          emplace<std::pair<QString,QString>>
                    ((QMovableArrayOps<std::pair<QString,QString>> *)&local_88,local_88.size,
                     (pair<QString,_QString> *)local_1b8);
          QList<std::pair<QString,_QString>_>::end((QList<std::pair<QString,_QString>_> *)&local_88)
          ;
          if ((QArrayData *)local_1b8._24_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_1b8._24_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_1b8._24_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_1b8._24_8_)->_q_value).super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate((QArrayData *)local_1b8._24_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_1b8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_1d8.a != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(local_1d8.a)->d)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&(local_1d8.a)->d)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&(local_1d8.a)->d)->_q_value).super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate((QArrayData *)local_1d8.a,2,0x10);
            }
          }
        }
        if ((local_188.m_length != 0) &&
           (bVar4 = ProString::operator==(&local_188,(ProString *)local_f8), !bVar4)) {
          local_1e8.b = (char (*) [5])0x1136da;
          local_1e8.a = (QString *)pQVar9;
          ProString::toQString((QString *)&local_1d8,&local_188);
          QStringBuilder<const_QString_&,_const_char_(&)[5]>::convertTo<QString>
                    ((QString *)local_1b8,&local_1e8);
          local_190 = local_1c8;
          pacStack_198 = local_1d8.b;
          local_1b8._24_8_ = local_1d8.a;
          local_1d8.a = (QString *)0x0;
          local_1d8.b = (char (*) [5])0x0;
          local_1c8 = 0;
          QtPrivate::QMovableArrayOps<std::pair<QString,QString>>::
          emplace<std::pair<QString,QString>>
                    ((QMovableArrayOps<std::pair<QString,QString>> *)&local_88,local_88.size,
                     (pair<QString,_QString> *)local_1b8);
          QList<std::pair<QString,_QString>_>::end((QList<std::pair<QString,_QString>_> *)&local_88)
          ;
          if ((QArrayData *)local_1b8._24_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_1b8._24_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_1b8._24_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_1b8._24_8_)->_q_value).super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate((QArrayData *)local_1b8._24_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_1b8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_1d8.a != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(local_1d8.a)->d)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&(local_1d8.a)->d)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&(local_1d8.a)->d)->_q_value).super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate((QArrayData *)local_1d8.a,2,0x10);
            }
          }
        }
        if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_158.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_158.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_128.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
          }
        }
        pQVar9 = (QArrayData *)&pQVar9[1].alloc;
        lVar8 = lVar8 + -0x18;
      } while (lVar8 != 0);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_c8);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
    local_1f8 = 0;
  }
  else {
    pQVar6 = (optionProperties->d).ptr;
    lVar8 = lVar8 * 0x18;
    local_1f8 = 0;
    do {
      local_48 = (char16_t *)0xaaaaaaaaaaaaaaaa;
      sStack_40 = 0xaaaaaaaaaaaaaaaa;
      local_68._16_8_ = 0xaaaaaaaaaaaaaaaa;
      pQStack_50 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
      local_68._0_8_ = (QArrayData *)0xaaaaaaaaaaaaaaaa;
      local_68._8_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
      ProKey::ProKey((ProKey *)local_68,pQVar6);
      bVar4 = hasValue(this,(ProKey *)local_68);
      if (bVar4) {
        value(&local_128,this,(ProKey *)local_68);
        ProString::toQString(&local_158.m_string,&local_128);
        sStack_d0 = local_158.m_string.d.size;
        pcStack_d8 = local_158.m_string.d.ptr;
        uStack_e0 = &(local_158.m_string.d.d)->super_QArrayData;
        local_f8._0_8_ = (pQVar6->d).d;
        local_f8._8_8_ = (pQVar6->d).ptr;
        local_f8._16_8_ = (pQVar6->d).size;
        if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((QArrayData *)local_f8._0_8_)->ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((QArrayData *)local_f8._0_8_)->ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_158.m_string.d.d = (Data *)0x0;
        local_158.m_string.d.ptr = (char16_t *)0x0;
        local_158.m_string.d.size = 0;
        QtPrivate::QMovableArrayOps<std::pair<QString,QString>>::emplace<std::pair<QString,QString>>
                  ((QMovableArrayOps<std::pair<QString,QString>> *)&local_88,local_88.size,
                   (pair<QString,_QString> *)local_f8);
        QList<std::pair<QString,_QString>_>::end((QList<std::pair<QString,_QString>_> *)&local_88);
        if (uStack_e0 != (QArrayData *)0x0) {
          LOCK();
          (uStack_e0->ref_)._q_value.super___atomic_base<int>._M_i =
               (uStack_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((uStack_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(uStack_e0,2,0x10);
          }
        }
        if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
          }
        }
        if (&(local_158.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_158.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_158.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_128.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        QVar11.m_data = (storage_type *)0xb;
        QVar11.m_size = (qsizetype)local_f8;
        QString::fromUtf8(QVar11);
        pQVar9 = &((pQVar6->d).d)->super_QArrayData;
        pcVar2 = (pQVar6->d).ptr;
        sVar3 = (pQVar6->d).size;
        if (pQVar9 != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&pQVar9->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)&pQVar9->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        uStack_e0 = (QArrayData *)local_f8._0_8_;
        pcStack_d8 = (char16_t *)local_f8._8_8_;
        sStack_d0 = local_f8._16_8_;
        local_f8._0_8_ = pQVar9;
        local_f8._8_8_ = pcVar2;
        local_f8._16_8_ = sVar3;
        QtPrivate::QMovableArrayOps<std::pair<QString,QString>>::emplace<std::pair<QString,QString>>
                  ((QMovableArrayOps<std::pair<QString,QString>> *)&local_88,local_88.size,
                   (pair<QString,_QString> *)local_f8);
        QList<std::pair<QString,_QString>_>::end((QList<std::pair<QString,_QString>_> *)&local_88);
        if (uStack_e0 != (QArrayData *)0x0) {
          LOCK();
          (uStack_e0->ref_)._q_value.super___atomic_base<int>._M_i =
               (uStack_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((uStack_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(uStack_e0,2,0x10);
          }
        }
        if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
          }
        }
        local_1f8 = 0x65;
      }
      if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
        }
      }
      pQVar6 = pQVar6 + 1;
      lVar8 = lVar8 + -0x18;
    } while (lVar8 != 0);
  }
  if ((printer->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  else {
    (*printer->_M_invoker)((_Any_data *)printer,(QList<std::pair<QString,_QString>_> *)&local_88);
    QArrayDataPointer<std::pair<QString,_QString>_>::~QArrayDataPointer(&local_88);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return local_1f8;
    }
  }
  __stack_chk_fail();
}

Assistant:

int QMakeProperty::queryProperty(const QStringList &optionProperties,
                                 const PropertyPrinter &printer)
{
    QList<QPair<QString, QString>> output;
    int ret = PropSuccessRetCode;
    if (optionProperties.isEmpty()) {
        initSettings();
        const auto keys = settings->childKeys();
        for (const QString &key : keys) {
            QString val = settings->value(key).toString();
            output.append({ key, val });
        }
        QStringList specialProps;
        for (unsigned i = 0; i < sizeof(propList) / sizeof(propList[0]); i++)
            specialProps.append(QString::fromLatin1(propList[i].name));
#ifdef QMAKE_VERSION_STR
        specialProps.append("QMAKE_VERSION");
#endif
#ifdef QT_VERSION_STR
        specialProps.append("QT_VERSION");
#endif
        for (const QString &prop : std::as_const(specialProps)) {
            ProString val = value(ProKey(prop));
            ProString pval = value(ProKey(prop + "/raw"));
            ProString gval = value(ProKey(prop + "/get"));
            ProString sval = value(ProKey(prop + "/src"));
            ProString dval = value(ProKey(prop + "/dev"));
            output.append({ prop, val.toQString() });
            if (!pval.isEmpty() && pval != val)
                output.append({ prop + "/raw", pval.toQString() });
            if (!gval.isEmpty() && gval != (pval.isEmpty() ? val : pval))
                output.append({ prop + "/get", gval.toQString() });
            if (!sval.isEmpty() && sval != gval)
                output.append({ prop + "/src", sval.toQString() });
            if (!dval.isEmpty() && dval != pval)
                output.append({ prop + "/dev", dval.toQString() });
        }
    } else {
        for (const auto &prop : optionProperties) {
            const ProKey pkey(prop);
            if (!hasValue(pkey)) {
                ret = PropFailRetCode;
                output.append({ prop, QString("**Unknown**") });
            } else {
                output.append({ prop, value(pkey).toQString() });
            }
        }
    }
    printer(output);
    return ret;
}